

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

void arima_summary(arima_object obj)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  double dVar7;
  
  iVar2 = obj->q + obj->p + obj->M;
  if ((uint)obj->method < 2) {
    puts("\n\nExit Status ");
    printf("Return Code : %d \n",(ulong)(uint)obj->retval);
    printf("Exit Message : ");
    iVar6 = obj->retval;
    if (iVar6 < 4) {
      if (iVar6 == 0) {
        pcVar3 = "Input Error";
      }
      else {
        if (iVar6 != 1) goto LAB_0010f250;
        pcVar3 = "Probable Success";
      }
    }
    else if (iVar6 == 4) {
      pcVar3 = "Optimization Routine didn\'t converge";
    }
    else {
      if (iVar6 != 0xf) goto LAB_0010f250;
      pcVar3 = "Optimization Routine Encountered Inf/Nan Values";
    }
    printf(pcVar3);
  }
LAB_0010f250:
  puts("\n");
  iVar6 = 0;
  printf(" ARIMA Order : ( %d, %d, %d) \n",(ulong)(uint)obj->p,(ulong)(uint)obj->d,
         (ulong)(uint)obj->q);
  putchar(10);
  printf("%-20s%-20s%-20s \n\n","Coefficients","Value","Standard Error");
  if (0 < obj->p) {
    lVar5 = 0;
    do {
      dVar7 = obj->phi[lVar5];
      if (obj->vcov[iVar6] < 0.0) {
        sqrt(obj->vcov[iVar6]);
      }
      lVar1 = lVar5 + 1;
      printf("AR%-15d%-20g%-20g \n",dVar7,(ulong)((int)lVar5 + 1));
      iVar6 = iVar6 + iVar2 + 1;
      lVar5 = lVar1;
    } while (lVar1 < obj->p);
  }
  if (0 < obj->q) {
    lVar5 = 0;
    do {
      iVar6 = (int)lVar5;
      dVar7 = obj->theta[lVar5];
      if (obj->vcov[(obj->p + iVar6) * (iVar2 + 1)] < 0.0) {
        sqrt(obj->vcov[(obj->p + iVar6) * (iVar2 + 1)]);
      }
      lVar5 = lVar5 + 1;
      printf("MA%-15d%-20g%-20g \n",dVar7,(ulong)(iVar6 + 1));
    } while (lVar5 < obj->q);
  }
  putchar(10);
  if (obj->M == 1) {
    dVar7 = obj->mean;
    if (obj->vcov[(iVar2 + 1) * (obj->q + obj->p)] < 0.0) {
      sqrt(obj->vcov[(iVar2 + 1) * (obj->q + obj->p)]);
    }
    printf("%-17s%-20g%-20g \n",dVar7,"MEAN");
  }
  else {
    printf("%-17s%-20g \n",obj->mean,"MEAN");
  }
  putchar(10);
  printf("%-17s%-20g \n",obj->var,"SIGMA^2");
  putchar(10);
  printf("ESTIMATION METHOD : ");
  if ((ulong)(uint)obj->method < 3) {
    printf(*(char **)(&DAT_0015dcf8 + (ulong)(uint)obj->method * 8));
  }
  puts("\n");
  printf("OPTIMIZATION METHOD : ");
  if (obj->method == 2) {
    pcVar3 = "Newton-Raphson";
  }
  else {
    if (7 < (ulong)(uint)obj->optmethod) goto LAB_0010f4bf;
    pcVar3 = (&PTR_anon_var_dwarf_b63_0015dda8)[(uint)obj->optmethod];
  }
  printf(pcVar3);
LAB_0010f4bf:
  puts("\n");
  printf("EQUATION FORM : x[t] ");
  if (0 < obj->p) {
    lVar5 = 0;
    do {
      dVar7 = obj->phi[lVar5];
      if (dVar7 <= 0.0) {
        if (dVar7 < 0.0) {
          dVar7 = ABS(dVar7);
          pcVar4 = "+ %g*x[t - %d%s";
          pcVar3 = "] ";
          goto LAB_0010f535;
        }
      }
      else {
        pcVar4 = "- %g*x[t - %d%s";
        pcVar3 = "]";
LAB_0010f535:
        printf(pcVar4,dVar7,(ulong)((int)lVar5 + 1),pcVar3);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < obj->p);
  }
  putchar(0x3d);
  if ((obj->mean != 0.0) || (NAN(obj->mean))) {
    printf(" %g +");
  }
  printf(" a[t] ");
  if (0 < obj->q) {
    lVar5 = 0;
    do {
      dVar7 = obj->theta[lVar5];
      if (dVar7 <= 0.0) {
        if (obj->phi[lVar5] <= 0.0 && obj->phi[lVar5] != 0.0) {
          dVar7 = ABS(dVar7);
          pcVar4 = "+ %g*a[t - %d%s";
          pcVar3 = "] ";
          goto LAB_0010f5e5;
        }
      }
      else {
        pcVar4 = "- %g*a[t - %d%s";
        pcVar3 = "]";
LAB_0010f5e5:
        printf(pcVar4,dVar7,(ulong)((int)lVar5 + 1),pcVar3);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < obj->q);
  }
  puts("\n");
  if ((uint)obj->method < 2) {
    printf("Log Likelihood : %g ",obj->loglik);
  }
  else {
    printf("Log Likelihood : Unavailable ");
  }
  puts("\n");
  if (obj->method == 0) {
    printf("AIC criterion : %g ",obj->aic);
  }
  else {
    printf("AIC Criterion : Unavailable ");
  }
  puts("\n");
  return;
}

Assistant:

void arima_summary(arima_object obj) {
	int i, pq,t;
	pq = obj->p + obj->q + obj->M;
	if (obj->method == 0 || obj->method == 1) {
		printf("\n\nExit Status \n");
		printf("Return Code : %d \n", obj->retval);
		printf("Exit Message : ");

		if (obj->retval == 0) {
			printf("Input Error");
		}
		else if (obj->retval == 1) {
			printf("Probable Success");
		}
		else if (obj->retval == 4) {
			printf("Optimization Routine didn't converge");
		}
		else if (obj->retval == 15) {
			printf("Optimization Routine Encountered Inf/Nan Values");
		}
	}
	printf("\n\n");
	printf(" ARIMA Order : ( %d, %d, %d) \n", obj->p, obj->d, obj->q);
	printf("\n");
	printf("%-20s%-20s%-20s \n\n", "Coefficients", "Value", "Standard Error");
	for (i = 0; i < obj->p; ++i) {
		printf("AR%-15d%-20g%-20g \n", i + 1, obj->phi[i],sqrt(obj->vcov[i+pq*i]));
	}
	for (i = 0; i < obj->q; ++i) {
		t = obj->p + i;
		printf("MA%-15d%-20g%-20g \n", i + 1, obj->theta[i], sqrt(obj->vcov[t + pq * t]));
	}
	printf("\n");
	t = obj->p + obj->q;
	if (obj->M == 1) {
		printf("%-17s%-20g%-20g \n", "MEAN", obj->mean, sqrt(obj->vcov[t + pq * t]));
	}
	else {
		printf("%-17s%-20g \n", "MEAN", obj->mean);
	}
	printf("\n");
	printf("%-17s%-20g \n", "SIGMA^2", obj->var);
	printf("\n");
	printf("ESTIMATION METHOD : ");
	if (obj->method == 0) {
		printf("MLE");
	}
	else if (obj->method == 1) {
		printf("CSS");
	}
	else if (obj->method == 2) {
		printf("BOX-JENKINS");
	}
	printf("\n\n");
	printf("OPTIMIZATION METHOD : ");
	if (obj->method == 2) {
		printf("Newton-Raphson");
	}
	else {
		if (obj->optmethod == 0) {
			printf("Nelder-Mead");
		}
		else if (obj->optmethod == 1) {
			printf("Newton Line Search");
		}
		else if (obj->optmethod == 2) {
			printf("Newton Trust Region - Hook Step");
		}
		else if (obj->optmethod == 3) {
			printf("Newton Trust Region - Double Dog-Leg");
		}
		else if (obj->optmethod == 4) {
			printf("Conjugate Gradient");
		}
		else if (obj->optmethod == 5) {
			printf("BFGS");
		}
		else if (obj->optmethod == 6) {
			printf("L-BFGS");
		}
		else if (obj->optmethod == 7) {
			printf("BFGS More-Thuente Line Search");
		}
	}
	printf("\n\n");
	printf("EQUATION FORM : x[t] ");
	for (i = 0; i < obj->p; ++i) {
		if (obj->phi[i] > 0) {
			printf("- %g*x[t - %d%s", fabs(obj->phi[i]), i + 1, "]");
		}
		else if (obj->phi[i] < 0) {
			printf("+ %g*x[t - %d%s", fabs(obj->phi[i]), i + 1, "] ");
		}
	}

	printf("=");
	if (obj->mean != 0.0) {
		printf(" %g +", obj->mean);
	}
	printf(" a[t] ");
	for (i = 0; i < obj->q; ++i) {
		if (obj->theta[i] > 0) {
			printf("- %g*a[t - %d%s", fabs(obj->theta[i]), i + 1, "]");
		}
		else if (obj->phi[i] < 0) {
			printf("+ %g*a[t - %d%s", fabs(obj->theta[i]), i + 1, "] ");
		}
	}
	printf("\n\n");
	if (obj->method == 0 || obj->method == 1) {
		printf("Log Likelihood : %g ", obj->loglik);
		printf("\n\n");
	}
	else {
		printf("Log Likelihood : Unavailable ");
		printf("\n\n");
	}
	if (obj->method == 0) {
		printf("AIC criterion : %g ", obj->aic);
		printf("\n\n");
	}
	else {
		printf("AIC Criterion : Unavailable ");
		printf("\n\n");
	}
}